

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleHashCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  ostream *poVar2;
  bool bVar3;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string out;
  ostringstream e;
  undefined1 local_1d8 [8];
  string local_1d0;
  string local_1b0;
  ostream local_190;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    poVar2 = std::operator<<(&local_190,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar2," requires a file name and output variable");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)(local_1d8 + 8));
    std::__cxx11::string::~string((string *)(local_1d8 + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    return false;
  }
  cmCryptoHash::New((cmCryptoHash *)local_1d8,(pbVar1->_M_dataplus)._M_p);
  if ((tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)local_1d8 !=
      (_Head_base<0UL,_cmCryptoHash_*,_false>)0x0) {
    cmCryptoHash::HashFile
              ((string *)(local_1d8 + 8),(cmCryptoHash *)local_1d8,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    if (local_1d0._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
      poVar2 = std::operator<<(&local_190,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      poVar2 = std::operator<<(poVar2," failed to read file \"");
      poVar2 = std::operator<<(poVar2,(string *)
                                      ((args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      poVar2 = std::operator<<(poVar2,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::operator<<(poVar2,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    }
    else {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,local_1d0._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)(local_1d8 + 8));
    bVar3 = true;
    if (local_1d0._M_string_length != 0) goto LAB_0024a9b6;
  }
  bVar3 = false;
LAB_0024a9b6:
  std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
            ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)local_1d8);
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleHashCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0].c_str()));
  if (hash) {
    std::string out = hash->HashFile(args[1]);
    if (!out.empty()) {
      this->Makefile->AddDefinition(args[2], out.c_str());
      return true;
    }
    std::ostringstream e;
    e << args[0] << " failed to read file \"" << args[1]
      << "\": " << cmSystemTools::GetLastSystemError();
    this->SetError(e.str());
  }
  return false;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str());
  return false;
#endif
}